

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

BasicHeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateBasicHeapType
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  ulong uVar1;
  uint32_t uVar2;
  BasicHeapType BVar3;
  value_type *pvVar4;
  BasicHeapType BVar5;
  initializer_list<wasm::HeapType> __l;
  HeapType local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> options;
  
  uVar2 = Random::upTo(this->rand,0x10);
  if (uVar2 == 0) {
    BVar3 = Random::
            pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                      (this->rand,noext,nofunc,none);
    if (0x7c < BVar3) goto LAB_00192aa7;
    BVar5 = BVar3 & 0x7b;
    if (share == Shared) {
      BVar5 = BVar3 | 4;
    }
  }
  else {
    local_58 = 0x30;
    uStack_50 = 0x38;
    local_68 = 0x20;
    uStack_60 = 0x28;
    local_78.id = 0x10;
    uStack_70 = 8;
    local_48 = 0x40;
    __l._M_len = 7;
    __l._M_array = &local_78;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40,__l,
               (allocator_type *)
               ((long)&options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if ((share == Unshared) && (((this->features).features & 0x40) != 0)) {
      local_78.id = 0x48;
      if (options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start ==
          options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40,
                   (iterator)
                   options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_start,&local_78);
      }
      else {
        (options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start)->id = 0x48;
        options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start =
             options.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
    }
    pvVar4 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this->rand,
                        (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_40);
    uVar1 = pvVar4->id;
    if ((share == Unshared) &&
       (share = Unshared,
       (uVar1 != 0x48 & *(byte *)((long)&(this->features).features + 2) >> 1) == 1)) {
      uVar2 = Random::upTo(this->rand,2);
      share = (Shareability)(uVar2 != 0);
    }
    if (0x7c < uVar1) {
LAB_00192aa7:
      __assert_fail("isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
    }
    BVar5 = (BasicHeapType)uVar1 & 0x7b;
    if (share == Shared) {
      BVar5 = (BasicHeapType)uVar1 | 4;
    }
    if (local_40 != (undefined1  [8])0x0) {
      operator_delete((void *)local_40,
                      (long)options.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_40);
    }
  }
  return BVar5;
}

Assistant:

HeapType::BasicHeapType generateBasicHeapType(Shareability share) {
    // Choose bottom types more rarely.
    // TODO: string and cont types
    if (rand.oneIn(16)) {
      HeapType ht =
        rand.pick(HeapType::noext, HeapType::nofunc, HeapType::none);
      return ht.getBasic(share);
    }

    std::vector<HeapType> options{HeapType::func,
                                  HeapType::ext,
                                  HeapType::any,
                                  HeapType::eq,
                                  HeapType::i31,
                                  HeapType::struct_,
                                  HeapType::array};
    // Avoid shared exn, which we cannot generate.
    if (features.hasExceptionHandling() && share == Unshared) {
      options.push_back(HeapType::exn);
    }
    auto ht = rand.pick(options);
    if (share == Unshared && features.hasSharedEverything() &&
        ht != HeapType::exn && rand.oneIn(2)) {
      share = Shared;
    }
    return ht.getBasic(share);
  }